

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O0

void __thiscall pg::TLQSolver::~TLQSolver(TLQSolver *this)

{
  TLQSolver *this_local;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__TLQSolver_0029cbf8;
  bitset::~bitset(&this->W1);
  bitset::~bitset(&this->W0);
  std::vector<int,_std::allocator<int>_>::~vector(&this->heads);
  std::vector<int,_std::allocator<int>_>::~vector(&this->Ps);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~vector(&this->Hs);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~vector(&this->Rs);
  bitset::~bitset(&this->S);
  bitset::~bitset(&this->G);
  uintqueue::~uintqueue(&this->Q);
  bitset::~bitset(&this->escapes);
  uintqueue::~uintqueue(&this->tangleto);
  std::vector<int,_std::allocator<int>_>::~vector(&this->tangle);
  bitset::~bitset(&this->pea_root);
  uintqueue::~uintqueue(&this->pea_S);
  uintqueue::~uintqueue(&this->pea_state);
  std::vector<int,_std::allocator<int>_>::~vector(&this->tpr);
  std::vector<int_*,_std::allocator<int_*>_>::~vector(&this->tv);
  std::vector<int_*,_std::allocator<int_*>_>::~vector(&this->tout);
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

TLQSolver::~TLQSolver()
{
}